

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

Vec_Wec_t * Cmd_ReadParamChoices(char *pConfig)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  Vec_Int_t *p;
  double dVar5;
  FILE *pFStack_420;
  char Param;
  FILE *pFile;
  char pBuffer [1000];
  char *pThis;
  Vec_Int_t *vLine;
  Vec_Wec_t *vPars;
  char *pConfig_local;
  
  pFStack_420 = fopen(pConfig,"rb");
  if (pFStack_420 == (FILE *)0x0) {
    printf("File containing list of files \"%s\" cannot be opened.\n",pConfig);
    pConfig_local = (char *)0x0;
  }
  else {
    pConfig_local = (char *)Vec_WecAlloc(100);
    while (pcVar3 = fgets((char *)&pFile,1000,pFStack_420), pcVar3 != (char *)0x0) {
      iVar2 = Cmf_IsSpace((char)pFile);
      if ((iVar2 == 0) && ((char)pFile != '#')) {
        while( true ) {
          sVar4 = strlen((char *)&pFile);
          iVar2 = Cmf_IsSpace((&Param)[sVar4]);
          if (iVar2 == 0) break;
          sVar4 = strlen((char *)&pFile);
          (&Param)[sVar4] = '\0';
        }
        p = Vec_WecPushLevel((Vec_Wec_t *)pConfig_local);
        pBuffer._992_8_ = &pFile;
        while (*(char *)pBuffer._992_8_ != '\0') {
          iVar2 = Cmf_IsLowerCaseChar(*(char *)pBuffer._992_8_);
          if (iVar2 == 0) {
            iVar2 = Cmf_IsUpperCaseChar(*(char *)pBuffer._992_8_);
            if (iVar2 == 0) {
              printf("Expecting a leading lower-case or upper-case digit in line \"%s\".\n",&pFile);
              return (Vec_Wec_t *)0x0;
            }
            pcVar3 = (char *)(pBuffer._992_8_ + 1);
            cVar1 = *(char *)pBuffer._992_8_;
            pBuffer._992_8_ = pcVar3;
            iVar2 = Cmf_IsDigit(*pcVar3);
            if (iVar2 == 0) {
              printf("Upper-case character (%c) should be followed by a number without space in line \"%s\".\n"
                     ,(ulong)(uint)(int)cVar1,&pFile);
              return (Vec_Wec_t *)0x0;
            }
            dVar5 = atof((char *)pBuffer._992_8_);
            iVar2 = Abc_Float2Int((float)dVar5);
            Vec_IntPushTwo(p,(int)cVar1,iVar2);
            while (iVar2 = Cmf_IsDigit(*(char *)pBuffer._992_8_), iVar2 != 0) {
              pBuffer._992_8_ = pBuffer._992_8_ + 1;
            }
            while (iVar2 = Cmf_IsSpace(*(char *)pBuffer._992_8_), iVar2 != 0) {
              pBuffer._992_8_ = pBuffer._992_8_ + 1;
            }
          }
          else {
            cVar1 = *(char *)pBuffer._992_8_;
            iVar2 = Abc_Float2Int(-1.0);
            Vec_IntPushTwo(p,(int)cVar1,iVar2);
            do {
              pBuffer._992_8_ = pBuffer._992_8_ + 1;
              iVar2 = Cmf_IsSpace(*(char *)pBuffer._992_8_);
            } while (iVar2 != 0);
          }
        }
      }
    }
    fclose(pFStack_420);
  }
  return (Vec_Wec_t *)pConfig_local;
}

Assistant:

Vec_Wec_t * Cmd_ReadParamChoices( char * pConfig )
{
    Vec_Wec_t * vPars;
    Vec_Int_t * vLine;
    char * pThis, pBuffer[CMD_AUTO_LINE_MAX];
    FILE * pFile = fopen( pConfig, "rb" );
    if ( pFile == NULL )
        { printf( "File containing list of files \"%s\" cannot be opened.\n", pConfig ); return NULL; }
    vPars = Vec_WecAlloc( 100 );
    while ( fgets( pBuffer, CMD_AUTO_LINE_MAX, pFile ) != NULL )
    {
        // get the command from the file
        if ( Cmf_IsSpace(pBuffer[0]) || pBuffer[0] == '#')
            continue;
        // skip trailing spaces
        while ( Cmf_IsSpace(pBuffer[strlen(pBuffer)-1]) )
            pBuffer[strlen(pBuffer)-1] = 0;
        // read the line
        vLine = Vec_WecPushLevel( vPars );
        for ( pThis = pBuffer; *pThis;  )
        {
            if ( Cmf_IsLowerCaseChar(*pThis) )
            {
                Vec_IntPushTwo( vLine, (int)*pThis, Abc_Float2Int((float)-1.0) );
                pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            if ( Cmf_IsUpperCaseChar(*pThis) )
            {
                char Param = *pThis++;
                if ( !Cmf_IsDigit(*pThis) )
                    { printf( "Upper-case character (%c) should be followed by a number without space in line \"%s\".\n", Param, pBuffer ); return NULL; }
                Vec_IntPushTwo( vLine, (int)Param, Abc_Float2Int(atof(pThis)) );
                while ( Cmf_IsDigit(*pThis) )
                    pThis++;
                while ( Cmf_IsSpace(*pThis) )
                    pThis++;
                continue;
            }
            printf( "Expecting a leading lower-case or upper-case digit in line \"%s\".\n", pBuffer ); 
            return NULL;
        }
    }
    fclose( pFile );
    return vPars;
}